

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

int Saig_ManDemiterCheckPo(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t **ppPo0,Aig_Obj_t **ppPo1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObjR1;
  Aig_Obj_t *pObjR0;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pFanin;
  Aig_Obj_t **ppPo1_local;
  Aig_Obj_t **ppPo0_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  pFanin = (Aig_Obj_t *)ppPo1;
  ppPo1_local = ppPo0;
  ppPo0_local = (Aig_Obj_t **)pObj;
  pObj_local = (Aig_Obj_t *)p;
  iVar1 = Saig_ObjIsPo(p,pObj);
  if (iVar1 == 0) {
    __assert_fail("Saig_ObjIsPo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x250,
                  "int Saig_ManDemiterCheckPo(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)"
                 );
  }
  pObj0 = Aig_ObjFanin0((Aig_Obj_t *)ppPo0_local);
  iVar1 = Aig_ObjIsConst1(pObj0);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsNode(pObj0);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      iVar1 = Aig_ObjRecognizeExor(pObj0,&pObj1,&pObjR0);
      if (iVar1 == 0) {
        p_local._4_4_ = 0;
      }
      else {
        iVar1 = Aig_ObjFaninC0((Aig_Obj_t *)ppPo0_local);
        if (iVar1 != 0) {
          pObj1 = Aig_Not(pObj1);
        }
        pAVar2 = Aig_Regular(pObj1);
        pAVar3 = Aig_Regular(pObjR0);
        if ((((((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) == 0) ||
              ((*(ulong *)&pAVar2->field_0x18 >> 5 & 1) == 0)) &&
             (((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) == 0 ||
              ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0)))) &&
            (((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) == 0 ||
             ((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) == 0)))) &&
           (((*(ulong *)&pAVar2->field_0x18 >> 5 & 1) == 0 ||
            ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0)))) {
          if (((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) == 0) ||
             ((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) != 0)) {
            if (((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) == 0) ||
               ((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) != 0)) {
              pAVar2 = Aig_Regular(pObj1);
              iVar1 = pAVar2->Id;
              pAVar2 = Aig_Regular(pObjR0);
              if (iVar1 < pAVar2->Id) {
                *ppPo1_local = pObj1;
                (pFanin->field_0).pNext = pObjR0;
              }
              else {
                *ppPo1_local = pObjR0;
                (pFanin->field_0).pNext = pObj1;
              }
            }
            else {
              *ppPo1_local = pObj1;
              (pFanin->field_0).pNext = pObjR0;
            }
          }
          else {
            *ppPo1_local = pObjR0;
            (pFanin->field_0).pNext = pObj1;
          }
          p_local._4_4_ = 1;
        }
        else {
          p_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    iVar1 = Aig_ObjFaninC0((Aig_Obj_t *)ppPo0_local);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      pAVar2 = Aig_ManConst0((Aig_Man_t *)pObj_local);
      *ppPo1_local = pAVar2;
      pAVar2 = Aig_ManConst0((Aig_Man_t *)pObj_local);
      (pFanin->field_0).pNext = pAVar2;
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManDemiterCheckPo( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t ** ppPo0, Aig_Obj_t ** ppPo1 )
{
    Aig_Obj_t * pFanin, * pObj0, * pObj1, * pObjR0, * pObjR1;
    assert( Saig_ObjIsPo(p, pObj) );
    pFanin = Aig_ObjFanin0( pObj );
    if ( Aig_ObjIsConst1(pFanin) )
    {
        if ( !Aig_ObjFaninC0(pObj) )
            return 0;
        *ppPo0 = Aig_ManConst0(p);
        *ppPo1 = Aig_ManConst0(p);
        return 1;
    }
    if ( !Aig_ObjIsNode(pFanin) )
        return 0;
    if ( !Aig_ObjRecognizeExor( pFanin, &pObj0, &pObj1 ) )
        return 0;
    if ( Aig_ObjFaninC0(pObj) )
        pObj0 = Aig_Not(pObj0);
    // make sure they can reach only one
    pObjR0 = Aig_Regular(pObj0);
    pObjR1 = Aig_Regular(pObj1);
    if ( (pObjR0->fMarkA && pObjR0->fMarkB) || (pObjR1->fMarkA && pObjR1->fMarkB) || 
         (pObjR0->fMarkA && pObjR1->fMarkA) || (pObjR0->fMarkB && pObjR1->fMarkB) )
         return 0;

    if ( pObjR1->fMarkA && !pObjR0->fMarkA )
    {
        *ppPo0 = pObj1;
        *ppPo1 = pObj0;
    }
    else if ( pObjR0->fMarkA && !pObjR1->fMarkA )
    {
        *ppPo0 = pObj0;
        *ppPo1 = pObj1;
    }
    else
    {
/*
printf( "%d", pObjR0->fMarkA );
printf( "%d", pObjR0->fMarkB );
printf( ":" );
printf( "%d", pObjR1->fMarkA );
printf( "%d", pObjR1->fMarkB );
printf( "   " );
*/
        if ( Aig_Regular(pObj0)->Id < Aig_Regular(pObj1)->Id )
        {
            *ppPo0 = pObj0;
            *ppPo1 = pObj1;
        }
        else
        {
            *ppPo0 = pObj1;
            *ppPo1 = pObj0;
        }
    }
    return 1;
}